

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diagnostic.cpp
# Opt level: O1

void spvtools::UseDiagnosticAsMessageConsumer(spv_context context,spv_diagnostic *diagnostic)

{
  _Any_data local_28;
  code *local_18;
  code *pcStack_10;
  
  if ((diagnostic != (spv_diagnostic *)0x0) && (*diagnostic == (spv_diagnostic)0x0)) {
    local_28._8_8_ = 0;
    pcStack_10 = std::
                 _Function_handler<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/diagnostic.cpp:120:28)>
                 ::_M_invoke;
    local_18 = std::
               _Function_handler<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/diagnostic.cpp:120:28)>
               ::_M_manager;
    local_28._M_unused._M_object = diagnostic;
    SetContextMessageConsumer(context,(MessageConsumer *)&local_28);
    if (local_18 != (code *)0x0) {
      (*local_18)(&local_28,&local_28,__destroy_functor);
    }
    return;
  }
  __assert_fail("diagnostic && *diagnostic == nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/diagnostic.cpp"
                ,0x76,"void spvtools::UseDiagnosticAsMessageConsumer(spv_context, spv_diagnostic *)"
               );
}

Assistant:

void UseDiagnosticAsMessageConsumer(spv_context context,
                                    spv_diagnostic* diagnostic) {
  assert(diagnostic && *diagnostic == nullptr);

  auto create_diagnostic = [diagnostic](spv_message_level_t, const char*,
                                        const spv_position_t& position,
                                        const char* message) {
    auto p = position;
    spvDiagnosticDestroy(*diagnostic);  // Avoid memory leak.
    *diagnostic = spvDiagnosticCreate(&p, message);
  };
  SetContextMessageConsumer(context, std::move(create_diagnostic));
}